

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::NegativeCompileErrors::Run(NegativeCompileErrors *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\nlayout(rgba32f) writeonly readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
             ,&local_39);
  bVar1 = Compile(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  lVar2 = -1;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "\nlayout(rgba32f) writeonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
               ,&local_39);
    bVar1 = Compile(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "\nuniform vec4 i_color;\nlayout(rgba32f) readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec2(0), i_color);\n  o_color = i_color;\n}"
                 ,&local_39);
      bVar1 = Compile(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "\nuniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                   ,&local_39);
        bVar1 = Compile(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,
                     "\nreadonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                     ,&local_39);
          bVar1 = Compile(this,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,
                       "\nlayout(r32i) uniform image1D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                       ,&local_39);
            bVar1 = Compile(this,&local_38);
            std::__cxx11::string::~string((string *)&local_38);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_38,
                         "\nlayout(rgba16) writeonly uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                         ,&local_39);
              bVar1 = Compile(this,&local_38);
              std::__cxx11::string::~string((string *)&local_38);
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_38,
                           "\n#extension GL_OES_shader_image_atomic : require\nlayout(r32f) coherent uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 10);\n  o_color = vec4(1.0);\n}"
                           ,&local_39);
                bVar1 = Compile(this,&local_38);
                std::__cxx11::string::~string((string *)&local_38);
                if (bVar1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_38,
                             "\n#extension GL_OES_shader_image_atomic : require\nlayout(rgba8i) coherent uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 1);\n  o_color = vec4(1.0);\n}"
                             ,&local_39);
                  bVar1 = Compile(this,&local_38);
                  std::__cxx11::string::~string((string *)&local_38);
                  if (bVar1) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_38,
                               "\nlayout(r32ui) uniform iimage3D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(1), ivec4(1));\n  o_color = vec4(1.0);\n}"
                               ,&local_39);
                    bVar1 = Compile(this,&local_38);
                    std::__cxx11::string::~string((string *)&local_38);
                    if (bVar1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_38,
                                 "\nlayout(r32f) uniform uimage2DArray g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(0), uvec4(1));\n  o_color = vec4(1.0);\n}"
                                 ,&local_39);
                      bVar1 = Compile(this,&local_38);
                      std::__cxx11::string::~string((string *)&local_38);
                      if (bVar1) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_38,
                                   "\nlayout(r32f) coherent uniform image2D g_image;\nvec4 Load(iimage2D image) {\n  return imageLoad(image, vec2(0));\n}\nvoid main() {\n  vec4 o_color;\n  o_color = Load(g_image);\n}"
                                   ,&local_39);
                        bVar1 = Compile(this,&local_38);
                        std::__cxx11::string::~string((string *)&local_38);
                        lVar2 = (ulong)bVar1 - 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!Compile( // writeonly & readonly qualifiers
				NL "layout(rgba32f) writeonly readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // writeonly && reading
				NL "layout(rgba32f) writeonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( //readonly && writing
				NL "uniform vec4 i_color;" NL "layout(rgba32f) readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  imageStore(g_image, ivec2(0), i_color);" NL "  o_color = i_color;" NL "}"))
			return ERROR;

		if (!Compile( // no format layout && load
				NL "uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // no fromat layout && readonly && load
				NL "readonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // target type image1D not supported
				NL "layout(r32i) uniform image1D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(rgba16) writeonly uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support r32f
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(r32f) coherent uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 10);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support rgba8i
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(rgba8i) coherent uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 1);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32ui) uniform iimage3D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(1), ivec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32f) uniform uimage2DArray g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(0), uvec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // wrong function argument type
				NL "layout(r32f) coherent uniform image2D g_image;" NL "vec4 Load(iimage2D image) {" NL
				   "  return imageLoad(image, vec2(0));" NL "}" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = Load(g_image);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}